

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_read_stream.hpp
# Opt level: O2

size_type __thiscall
io::buffered_read_stream<io::posix::file,_std::allocator<unsigned_char>_>::fill
          (buffered_read_stream<io::posix::file,_std::allocator<unsigned_char>_> *this,
          error_code *ec)

{
  buffer_type *this_00;
  size_type sVar1;
  size_type sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  mutable_buffer mVar7;
  buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_>
  resize_guard;
  buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_> local_40
  ;
  mutable_buffer local_30;
  
  this_00 = &this->storage_;
  uVar6 = (this->storage_).end_ - (this->storage_).begin_;
  local_40.buf_ = this_00;
  local_40.old_size_ = uVar6;
  detail::buffered_stream_storage<std::allocator<unsigned_char>_>::resize
            (this_00,(long)(this->storage_).vec_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->storage_).vec_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  mVar7 = detail::buffered_stream_storage<std::allocator<unsigned_char>_>::data(this_00);
  uVar5 = mVar7.size_;
  uVar4 = uVar6;
  if (uVar5 < uVar6) {
    uVar4 = uVar5;
  }
  local_30.data_ = (void *)((long)mVar7.data_ + uVar4);
  local_30.size_ = ((this->storage_).end_ + uVar6) - (this->storage_).begin_;
  if (uVar5 - uVar4 < local_30.size_) {
    local_30.size_ = uVar5 - uVar4;
  }
  sVar3 = posix::file::read_some(&this->base_,&local_30,ec);
  detail::buffered_stream_storage<std::allocator<unsigned_char>_>::resize(this_00,sVar3 + uVar6);
  local_40.old_size_ = 0xffffffffffffffff;
  sVar1 = (this->storage_).end_;
  sVar2 = (this->storage_).begin_;
  detail::buffer_resize_guard<io::detail::buffered_stream_storage<std::allocator<unsigned_char>_>_>
  ::~buffer_resize_guard(&local_40);
  return sVar1 - (uVar6 + sVar2);
}

Assistant:

size_type fill(std::error_code& ec)
    {
        detail::buffer_resize_guard<buffer_type> resize_guard(storage_);
        auto prev_size = storage_.size();
        storage_.resize(storage_.capacity()); // ?
        storage_.resize(prev_size +
                base_.read_some(io::buffer(
                storage_.data() + prev_size,
                storage_.size() + prev_size),
                                ec
        ));
        resize_guard.commit();
        return storage_.size() - prev_size;
    }